

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix<Complex>::operator==(Matrix<Complex> *this,Matrix<Complex> *a)

{
  compare_t cVar1;
  long lVar2;
  Complex *this_00;
  ulong uVar3;
  Complex *a_00;
  bool bVar4;
  
  if ((this->M == a->M) && (this->N == a->N)) {
    bVar4 = this->M * this->N == 0;
    if (!bVar4) {
      this_00 = this->arr;
      a_00 = a->arr;
      cVar1 = Rational::compare(&this_00->_re,&a_00->_re);
      if (cVar1 == CMP_EQUAL) {
        uVar3 = 0;
        lVar2 = 0x80;
        do {
          cVar1 = Rational::compare(&this_00->_im,&a_00->_im);
          if (cVar1 != CMP_EQUAL) {
            return bVar4;
          }
          uVar3 = uVar3 + 1;
          bVar4 = this->M * this->N <= uVar3;
          if (bVar4) {
            return bVar4;
          }
          this_00 = this->arr + uVar3;
          a_00 = a->arr + uVar3;
          cVar1 = Rational::compare((Rational *)
                                    ((long)&(this->arr->_re)._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar2),
                                    (Rational *)
                                    ((long)&(a->arr->_re)._numerator.digits.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar2));
          lVar2 = lVar2 + 0x80;
        } while (cVar1 == CMP_EQUAL);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Matrix<Field>::operator==(const Matrix &a) const
{
    if(M != a.M || N != a.N)
        return false;
    for(unsigned i = 0; i < N * M; ++i)
    {
        if(arr[i] != a.arr[i])
            return false;
    }
    return true;
}